

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_boost_po_test.cc
# Opt level: O0

void typed_options_parsing_invoker(void)

{
  basic_wrap_stringstream<char> *this;
  basic_wrap_stringstream<char> *s;
  basic_wrap_stringstream<char> *this_00;
  typed_options_parsing t;
  char (*in_stack_fffffffffffff618) [22];
  basic_wrap_stringstream<char> *in_stack_fffffffffffff620;
  std_string *in_stack_fffffffffffff628;
  basic_cstring<const_char> *in_stack_fffffffffffff630;
  basic_wrap_stringstream<char> *in_stack_fffffffffffff640;
  basic_wrap_stringstream<char> *pbVar1;
  basic_wrap_stringstream<char> local_8c0;
  undefined1 local_728 [16];
  basic_cstring<const_char> local_718;
  undefined1 local_701;
  basic_wrap_stringstream<char> local_700;
  undefined1 local_568 [16];
  basic_cstring<const_char> local_558;
  undefined1 local_541;
  basic_wrap_stringstream<char> local_540;
  undefined1 local_3a8 [16];
  basic_cstring<const_char> local_398;
  undefined1 local_381;
  basic_wrap_stringstream<char> local_380;
  undefined1 local_1e8 [16];
  basic_cstring<const_char> local_1d8;
  undefined1 local_1c5;
  typed_options_parsing *in_stack_ffffffffffffffb0;
  undefined1 local_20 [16];
  basic_cstring<const_char> local_10;
  
  pbVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_10,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/test/unit_test/options_boost_po_test.cc"
             ,0x76);
  memset((basic_wrap_stringstream<char> *)&stack0xfffffffffffffe48,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff620);
  boost::basic_wrap_stringstream<char>::ref
            ((basic_wrap_stringstream<char> *)&stack0xfffffffffffffe48);
  local_1c5 = 0x22;
  boost::operator<<(in_stack_fffffffffffff620,*in_stack_fffffffffffff618);
  boost::operator<<(in_stack_fffffffffffff620,in_stack_fffffffffffff618);
  boost::operator<<(in_stack_fffffffffffff620,(char (*) [15])in_stack_fffffffffffff618);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff640);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            (in_stack_fffffffffffff630,in_stack_fffffffffffff628);
  boost::unit_test::unit_test_log_t::set_checkpoint(pbVar1,&local_10,0x22,local_20);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff620);
  pbVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_1d8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/test/unit_test/options_boost_po_test.cc"
             ,0x76);
  memset(&local_380,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff620);
  boost::basic_wrap_stringstream<char>::ref(&local_380);
  local_381 = 0x22;
  boost::operator<<(in_stack_fffffffffffff620,*in_stack_fffffffffffff618);
  boost::operator<<(in_stack_fffffffffffff620,in_stack_fffffffffffff618);
  boost::operator<<(in_stack_fffffffffffff620,(char (*) [16])in_stack_fffffffffffff618);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff640);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            (in_stack_fffffffffffff630,in_stack_fffffffffffff628);
  boost::unit_test::unit_test_log_t::set_checkpoint(pbVar1,&local_1d8,0x22,local_1e8);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff620);
  boost::unit_test::setup_conditional<typed_options_parsing>
            ((typed_options_parsing *)in_stack_fffffffffffff620);
  pbVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_398,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/test/unit_test/options_boost_po_test.cc"
             ,0x76);
  memset(&local_540,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff620);
  boost::basic_wrap_stringstream<char>::ref(&local_540);
  local_541 = 0x22;
  boost::operator<<(in_stack_fffffffffffff620,*in_stack_fffffffffffff618);
  boost::operator<<(in_stack_fffffffffffff620,in_stack_fffffffffffff618);
  boost::operator<<(in_stack_fffffffffffff620,(char (*) [13])in_stack_fffffffffffff618);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff640);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            (in_stack_fffffffffffff630,in_stack_fffffffffffff628);
  boost::unit_test::unit_test_log_t::set_checkpoint(pbVar1,&local_398,0x22,local_3a8);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff620);
  typed_options_parsing::test_method(in_stack_ffffffffffffffb0);
  pbVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_558,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/test/unit_test/options_boost_po_test.cc"
             ,0x76);
  memset(&local_700,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff620);
  boost::basic_wrap_stringstream<char>::ref(&local_700);
  local_701 = 0x22;
  boost::operator<<(in_stack_fffffffffffff620,*in_stack_fffffffffffff618);
  boost::operator<<(in_stack_fffffffffffff620,in_stack_fffffffffffff618);
  boost::operator<<(in_stack_fffffffffffff620,(char (*) [19])in_stack_fffffffffffff618);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff640);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            (in_stack_fffffffffffff630,in_stack_fffffffffffff628);
  boost::unit_test::unit_test_log_t::set_checkpoint(pbVar1,&local_558,0x22,local_568);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff620);
  boost::unit_test::teardown_conditional<typed_options_parsing>
            ((typed_options_parsing *)in_stack_fffffffffffff620);
  pbVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_718,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/test/unit_test/options_boost_po_test.cc"
             ,0x76);
  memset(&local_8c0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff620);
  boost::basic_wrap_stringstream<char>::ref(&local_8c0);
  boost::operator<<(in_stack_fffffffffffff620,*in_stack_fffffffffffff618);
  this = boost::operator<<(in_stack_fffffffffffff620,in_stack_fffffffffffff618);
  s = boost::operator<<(in_stack_fffffffffffff620,(char (*) [15])in_stack_fffffffffffff618);
  this_00 = (basic_wrap_stringstream<char> *)
            boost::basic_wrap_stringstream<char>::str_abi_cxx11_(pbVar1);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)this,(std_string *)s);
  boost::unit_test::unit_test_log_t::set_checkpoint(pbVar1,&local_718,0x22,local_728);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(this_00);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(typed_options_parsing) {
  std::string str_arg;
  int int_opt;
  bool bool_opt;
  char char_opt;
  float float_opt;

  char command_line[] = "exe --str_opt test_str -i 5 --bool_opt yes --char_opt f --float_opt 4.3";
  int argc;
  // Only the returned char* needs to be deleted as the individual pointers simply point into command_line.
  std::unique_ptr<char*> argv(convert_to_command_args(command_line, argc));

  std::unique_ptr<options_i> options = std::unique_ptr<options_boost_po>(
    new options_boost_po(argc, argv.get()));

  option_group_definition arg_group("group");
  arg_group.add(make_option("str_opt", str_arg));
  arg_group.add(make_option("int_opt", int_opt).short_name("i"));
  arg_group.add(make_option("bool_opt", bool_opt));
  arg_group.add(make_option("char_opt", char_opt));
  arg_group.add(make_option("float_opt", float_opt));

  BOOST_CHECK_NO_THROW(options->add_and_parse(arg_group));

  BOOST_CHECK_EQUAL(str_arg, "test_str");
  BOOST_CHECK_EQUAL(int_opt, 5);
  BOOST_CHECK_EQUAL(bool_opt, true);
  BOOST_CHECK_EQUAL(char_opt, 'f');
  BOOST_CHECK_CLOSE(float_opt, 4.3f, 0.001f);
}